

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

NTrodeObj * __thiscall
TrodesConfig::getNTrodeByID(NTrodeObj *__return_storage_ptr__,TrodesConfig *this,string *id)

{
  pointer pNVar1;
  pointer pcVar2;
  int iVar3;
  pointer pNVar4;
  bool bVar5;
  bool bVar6;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pNVar4 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar5 = pNVar4 == pNVar1;
  if (!bVar5) {
    do {
      pcVar2 = (pNVar4->id)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (pNVar4->id)._M_string_length);
      if (local_48 == id->_M_string_length) {
        if (local_48 == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp(local_50,(id->_M_dataplus)._M_p,local_48);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (bVar6) {
        (__return_storage_ptr__->super_NetworkDataType)._vptr_NetworkDataType =
             (_func_int **)&PTR__NTrodeObj_003edd18;
        (__return_storage_ptr__->id)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->id).field_2;
        pcVar2 = (pNVar4->id)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->id,pcVar2,
                   pcVar2 + (pNVar4->id)._M_string_length);
        __return_storage_ptr__->index = pNVar4->index;
        std::vector<int,_std::allocator<int>_>::vector
                  (&__return_storage_ptr__->hw_chans,&pNVar4->hw_chans);
        if (!bVar5) {
          return __return_storage_ptr__;
        }
        break;
      }
      pNVar4 = pNVar4 + 1;
      bVar5 = pNVar4 == pNVar1;
    } while (!bVar5);
  }
  NTrodeObj::NTrodeObj(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

NTrodeObj TrodesConfig::getNTrodeByID(const std::string &id) const{
    for(auto const &nt : nTrodes){
        if(nt.getId() == id){
            return nt;
        }
    }
    return NTrodeObj();
}